

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

CacheEntryType cmState::StringToCacheEntryType(char *s)

{
  int iVar1;
  CacheEntryType local_1c;
  int i;
  char *s_local;
  
  local_1c = BOOL;
  while( true ) {
    if (cmCacheEntryTypes[(int)local_1c] == (char *)0x0) {
      return STRING;
    }
    iVar1 = strcmp(s,cmCacheEntryTypes[(int)local_1c]);
    if (iVar1 == 0) break;
    local_1c = local_1c + PATH;
  }
  return local_1c;
}

Assistant:

cmStateEnums::CacheEntryType cmState::StringToCacheEntryType(const char* s)
{
  int i = 0;
  while (cmCacheEntryTypes[i]) {
    if (strcmp(s, cmCacheEntryTypes[i]) == 0) {
      return static_cast<cmStateEnums::CacheEntryType>(i);
    }
    ++i;
  }
  return cmStateEnums::STRING;
}